

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuredDimensionCallout,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcStructuredDimensionCallout *in;
  
  in = (IfcStructuredDimensionCallout *)operator_new(0x70);
  *(undefined ***)&(in->super_IfcDraughtingCallout).field_0x58 = &PTR__Object_00836880;
  *(undefined8 *)&in->field_0x60 = 0;
  *(char **)&in->field_0x68 = "IfcStructuredDimensionCallout";
  Assimp::IFC::Schema_2x3::IfcDraughtingCallout::IfcDraughtingCallout
            ((IfcDraughtingCallout *)in,&PTR_construction_vtable_24__0089be60);
  (in->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcStructuredDimensionCallout_0089bda8;
  *(undefined ***)&(in->super_IfcDraughtingCallout).field_0x58 =
       &PTR__IfcStructuredDimensionCallout_0089be48;
  *(undefined ***)
   &(in->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcStructuredDimensionCallout_0089bdd0;
  *(undefined ***)
   &(in->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcStructuredDimensionCallout_0089bdf8;
  *(undefined ***)&(in->super_IfcDraughtingCallout).field_0x48 =
       &PTR__IfcStructuredDimensionCallout_0089be20;
  GenericFill<Assimp::IFC::Schema_2x3::IfcStructuredDimensionCallout>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }